

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O0

int fe_spch_to_frame(fe_t *fe,int len)

{
  int len_local;
  fe_t *fe_local;
  
  if (((float)fe->pre_emphasis_alpha != 0.0) || (NAN((float)fe->pre_emphasis_alpha))) {
    fe_pre_emphasis_int16(fe->spch,fe->frame,len,fe->pre_emphasis_alpha,fe->pre_emphasis_prior);
    if (len < fe->frame_shift) {
      fe->pre_emphasis_prior = fe->spch[len + -1];
    }
    else {
      fe->pre_emphasis_prior = fe->spch[fe->frame_shift + -1];
    }
  }
  else {
    fe_copy_to_frame_int16(fe->spch,fe->frame,len);
  }
  memset(fe->frame + len,0,(long)(fe->fft_size - len) << 3);
  fe_hamming_window(fe->frame,fe->hamming_window,(int)fe->frame_size,(uint)fe->remove_dc);
  return len;
}

Assistant:

static int
fe_spch_to_frame(fe_t * fe, int len)
{
    /* Copy to the frame buffer. */
    if (fe->pre_emphasis_alpha != 0.0) {
        fe_pre_emphasis_int16(fe->spch, fe->frame, len,
                              fe->pre_emphasis_alpha,
                              fe->pre_emphasis_prior);
        if (len >= fe->frame_shift)
            fe->pre_emphasis_prior = fe->spch[fe->frame_shift - 1];
        else
            fe->pre_emphasis_prior = fe->spch[len - 1];
    }
    else
        fe_copy_to_frame_int16(fe->spch, fe->frame, len);

    /* Zero pad up to FFT size. */
    memset(fe->frame + len, 0, (fe->fft_size - len) * sizeof(*fe->frame));

    /* Window. */
    fe_hamming_window(fe->frame, fe->hamming_window, fe->frame_size,
                      fe->remove_dc);

    return len;
}